

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O1

void __thiscall Permutazione::differenza(Permutazione *this,Permutazione *p)

{
  ushort uVar1;
  unsigned_short *puVar2;
  void *__dest;
  unsigned_short *puVar3;
  ulong uVar4;
  unsigned_short k;
  
  uVar1 = this->dimensione;
  uVar4 = (ulong)((uint)uVar1 * 2);
  __dest = operator_new__(uVar4);
  puVar3 = (unsigned_short *)operator_new__(uVar4);
  puVar2 = p->individuo;
  memcpy(__dest,puVar2,uVar4);
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      *(short *)((long)__dest + (ulong)puVar2[uVar4] * 2) = (short)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    puVar2 = this->individuo;
    uVar4 = 0;
    do {
      puVar3[uVar4] = *(unsigned_short *)((long)__dest + (ulong)puVar2[uVar4] * 2);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (this->individuo != (unsigned_short *)0x0) {
    operator_delete__(this->individuo);
  }
  operator_delete__(__dest);
  this->individuo = puVar3;
  return;
}

Assistant:

void Permutazione::differenza(Permutazione* p) {

	unsigned short* pCopia = new unsigned short[dimensione];
	unsigned short* thisCopia = new unsigned short[dimensione];
	
	//copiamo l'individuo p
	memcpy(pCopia, p->individuo, sizeof(unsigned short) * dimensione);

	//p^-1 
	for (unsigned short k = 0; k < dimensione; k++) {
		pCopia[p->individuo[k]] = k;
	}

	//p^-1 + this
	for (unsigned short k = 0; k < dimensione; k++) {
		thisCopia[k] = pCopia[this->individuo[k]];
	}

	//assegnamolo a this
	delete[] this->individuo;
	delete[] pCopia;
	this->individuo = thisCopia;
}